

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleShape.h
# Opt level: O0

bool __thiscall btTriangleShape::isInside(btTriangleShape *this,btVector3 *pt,btScalar tolerance)

{
  btVector3 *in_RSI;
  btVector3 *in_RDI;
  float in_XMM0_Da;
  btScalar bVar1;
  btScalar edgeConst;
  btScalar dist_1;
  btVector3 edgeNormal;
  btVector3 edge;
  btVector3 pb;
  btVector3 pa;
  int i;
  btScalar planeconst;
  btScalar dist;
  btVector3 normal;
  btVector3 *this_00;
  btScalar in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  btVector3 local_78;
  btScalar local_68 [4];
  btVector3 *in_stack_ffffffffffffffa8;
  btTriangleShape *in_stack_ffffffffffffffb0;
  btVector3 local_48;
  int local_38;
  btScalar local_34;
  float local_30;
  btVector3 local_2c;
  float local_1c;
  btVector3 *local_18;
  bool local_1;
  
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  btVector3::btVector3(&local_2c);
  calcNormal(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_30 = btVector3::dot(local_18,&local_2c);
  local_34 = btVector3::dot(in_RDI + 5,&local_2c);
  local_30 = local_30 - local_34;
  if ((local_30 < -local_1c) || (local_1c < local_30)) {
    local_1 = false;
  }
  else {
    for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
      this_00 = &local_48;
      btVector3::btVector3(this_00);
      btVector3::btVector3((btVector3 *)&stack0xffffffffffffffa8);
      (**(code **)(*(long *)in_RDI->m_floats + 0xd0))
                (in_RDI,local_38,this_00,(btVector3 *)&stack0xffffffffffffffa8);
      local_68 = (btScalar  [4])
                 operator-((btVector3 *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_RDI);
      local_78 = btVector3::cross((btVector3 *)
                                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                  in_RDI);
      btVector3::normalize(this_00);
      bVar1 = btVector3::dot(local_18,&local_78);
      in_stack_ffffffffffffff80 = btVector3::dot(&local_48,&local_78);
      in_stack_ffffffffffffff84 = bVar1 - in_stack_ffffffffffffff80;
      if (in_stack_ffffffffffffff84 < -local_1c) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

virtual	bool isInside(const btVector3& pt,btScalar tolerance) const
	{
		btVector3 normal;
		calcNormal(normal);
		//distance to plane
		btScalar dist = pt.dot(normal);
		btScalar planeconst = m_vertices1[0].dot(normal);
		dist -= planeconst;
		if (dist >= -tolerance && dist <= tolerance)
		{
			//inside check on edge-planes
			int i;
			for (i=0;i<3;i++)
			{
				btVector3 pa,pb;
				getEdge(i,pa,pb);
				btVector3 edge = pb-pa;
				btVector3 edgeNormal = edge.cross(normal);
				edgeNormal.normalize();
				btScalar dist = pt.dot( edgeNormal);
				btScalar edgeConst = pa.dot(edgeNormal);
				dist -= edgeConst;
				if (dist < -tolerance)
					return false;
			}
			
			return true;
		}

		return false;
	}